

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

Error __thiscall asmjit::VMemMgr::shrink(VMemMgr *this,void *p,size_t used)

{
  Error EVar1;
  MemNode *pMVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  size_t *psVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  
  if (p == (void *)0x0) {
    return 0;
  }
  if (used == 0) {
    EVar1 = release(this,p);
    return EVar1;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  pMVar2 = vMemMgrFindNodeByPtr(this,(uint8_t *)p);
  if (pMVar2 != (MemNode *)0x0) {
    uVar5 = pMVar2->density;
    uVar9 = 0;
    uVar3 = (ulong)((long)p - (long)(pMVar2->super_RbNode).mem) / uVar5;
    uVar6 = uVar3 >> 6;
    psVar8 = pMVar2->baUsed + uVar6;
    puVar7 = pMVar2->baCont + uVar6;
    uVar3 = 1L << (uVar3 & 0x3f);
    do {
      uVar6 = *puVar7;
      do {
        if ((uVar3 & uVar6) == 0) goto LAB_00152a96;
        uVar9 = uVar9 + 1;
        if (((used - 1) + uVar5) / uVar5 == uVar9) {
          sVar10 = *psVar8;
          lVar4 = 0;
          bVar11 = false;
          goto LAB_00152a3a;
        }
        uVar3 = uVar3 * 2;
      } while (uVar3 != 0);
      psVar8 = psVar8 + 1;
      puVar7 = puVar7 + 1;
      uVar3 = 1;
    } while( true );
  }
  EVar1 = 3;
LAB_00152a98:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return EVar1;
LAB_00152a3a:
  uVar6 = ~uVar3 & uVar6;
  uVar3 = uVar3 * 2;
  if (uVar3 == 0 || bVar11) {
    *psVar8 = sVar10;
    *puVar7 = uVar6;
    if (bVar11) goto LAB_00152a7f;
    sVar10 = psVar8[1];
    uVar6 = puVar7[1];
    psVar8 = psVar8 + 1;
    puVar7 = puVar7 + 1;
    uVar3 = 1;
  }
  bVar11 = (uVar3 & uVar6) == 0;
  sVar10 = ~uVar3 & sVar10;
  lVar4 = lVar4 + 1;
  goto LAB_00152a3a;
LAB_00152a7f:
  uVar5 = lVar4 * pMVar2->density;
  if (pMVar2->largestBlock < uVar5) {
    pMVar2->largestBlock = uVar5;
  }
  pMVar2->used = pMVar2->used - uVar5;
  this->_usedBytes = this->_usedBytes - uVar5;
LAB_00152a96:
  EVar1 = 0;
  goto LAB_00152a98;
}

Assistant:

Error VMemMgr::shrink(void* p, size_t used) noexcept {
  if (!p) return kErrorOk;
  if (used == 0)
    return release(p);

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, (uint8_t*)p);
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  size_t usedBlocks = (used + node->density - 1) / node->density;

  bool stop;

  // Find the first block we can mark as free.
  for (;;) {
    stop = (cbits & bit) == 0;
    if (stop)
      return kErrorOk;

    if (++cont == usedBlocks)
      break;

    bit <<= 1;
    if (bit == 0) {
      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Free the tail blocks.
  cont = ~(size_t)0;
  goto _EnterFreeLoop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;

_EnterFreeLoop:
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  return kErrorOk;
}